

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalStreamingWindow::ExecuteInput
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *delayed,
          DataChunk *input,DataChunk *output,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  reference this_00;
  reference other;
  idx_t col_idx;
  ulong __n;
  idx_t offset;
  
  for (__n = 0; __n < (ulong)(((long)(input->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(input->data).
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x68);
      __n = __n + 1) {
    this_00 = vector<duckdb::Vector,_true>::get<true>(&output->data,__n);
    other = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    Vector::Reference(this_00,other);
  }
  offset = input->count;
  if (state_p[0xc]._vptr_OperatorState != (_func_int **)0x0) {
    offset = offset - (long)state_p[0xc]._vptr_OperatorState;
    DataChunk::Copy(input,delayed,offset);
  }
  output->count = offset;
  ExecuteFunctions(this,context,output,(DataChunk *)(state_p + 0xd),gstate_p,state_p);
  return;
}

Assistant:

void PhysicalStreamingWindow::ExecuteInput(ExecutionContext &context, DataChunk &delayed, DataChunk &input,
                                           DataChunk &output, GlobalOperatorState &gstate_p,
                                           OperatorState &state_p) const {
	auto &state = state_p.Cast<StreamingWindowState>();

	// Put payload columns in place
	for (idx_t col_idx = 0; col_idx < input.data.size(); col_idx++) {
		output.data[col_idx].Reference(input.data[col_idx]);
	}
	idx_t count = input.size();

	//	Handle LEAD
	if (state.lead_count > 0) {
		//	Nothing delayed yet, so just truncate and copy the delayed values
		count -= state.lead_count;
		input.Copy(delayed, count);
	}
	output.SetCardinality(count);

	ExecuteFunctions(context, output, state.delayed, gstate_p, state_p);
}